

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_socket.h
# Opt level: O0

size_t get_sa_len(sockaddr *addr)

{
  sockaddr *addr_local;
  
  if (addr->sa_family == 2) {
    addr_local = (sockaddr *)0x10;
  }
  else if (addr->sa_family == 10) {
    addr_local = (sockaddr *)0x1c;
  }
  else {
    addr_local = (sockaddr *)0x10;
  }
  return (size_t)addr_local;
}

Assistant:

static inline size_t get_sa_len(struct sockaddr *addr) {
    switch (addr->sa_family) {

    case AF_INET:
        return (sizeof(struct sockaddr_in));

    case AF_INET6:
        return (sizeof(struct sockaddr_in6));

    default:
        return (sizeof(struct sockaddr));
    }
}